

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string flag_str;
  allocator local_29;
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_90,"--",&local_29);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&flag_str.field_2 + 8),&local_90,"gtest_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&flag_str.field_2 + 8),flag);
    std::__cxx11::string::~string((string *)(flag_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_90);
    iVar1 = strncmp(str,(char *)local_70,(size_t)flag_str._M_dataplus._M_p);
    if (iVar1 == 0) {
      pcVar2 = str + (long)flag_str._M_dataplus._M_p;
      if (((!def_optional) || (str[(long)flag_str._M_dataplus._M_p] != '\0')) &&
         (pcVar2 = pcVar2 + 1, str[(long)flag_str._M_dataplus._M_p] != '=')) {
        pcVar2 = (char *)0x0;
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  return pcVar2;
}

Assistant:

static const char* ParseFlagValue(const char* str, const char* flag,
                                  bool def_optional) {
  // str and flag must not be NULL.
  if (str == nullptr || flag == nullptr) return nullptr;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}